

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void compact_float32_suite::test_array16_float32_empty(void)

{
  value *pvVar1;
  value vVar2;
  value_type input [3];
  decoder decoder;
  value local_5c [2];
  uchar local_54 [4];
  decoder local_50;
  
  local_50.input._M_str = local_54;
  local_54[2] = 0;
  local_54[0] = 0xbd;
  local_54[1] = '\0';
  local_50.input._M_len = 3;
  local_50.current.view._M_len = 0;
  local_50.current.view._M_str = (uchar *)0x0;
  local_50.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_5c[0] = local_50.current.code;
  pvVar1 = local_5c + 1;
  local_5c[1] = 0xbd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array16_float32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd4b,"void compact_float32_suite::test_array16_float32_empty()",local_5c,pvVar1);
  local_5c[0] = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_5c[1] = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd4c,"void compact_float32_suite::test_array16_float32_empty()",local_5c,pvVar1);
  vVar2 = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_5c[0] = end;
  if (vVar2 - null < 0xc) {
    local_5c[0] = *(value *)(&DAT_00124a00 + (ulong)(vVar2 - null) * 4);
  }
  local_5c[1] = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd4d,"void compact_float32_suite::test_array16_float32_empty()",local_5c,pvVar1);
  boost::detail::test_impl
            ("decoder.literal().empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd4e,"void compact_float32_suite::test_array16_float32_empty()",
             local_50.current.view._M_len == 0);
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_5c[0] = local_50.current.code;
  local_5c[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd50,"void compact_float32_suite::test_array16_float32_empty()",local_5c,pvVar1);
  return;
}

Assistant:

void test_array16_float32_empty()
{
    const value_type input[] = { token::code::array16_float32, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array16_float32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(decoder.literal().empty());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}